

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

CHAR_DATA * get_char_room(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA **ppCVar4;
  char arg [4608];
  char local_1238 [4616];
  
  iVar2 = number_argument(argument,local_1238);
  bVar1 = str_cmp(local_1238,"self");
  if (bVar1) {
    ppCVar4 = &ch->in_room->people;
    iVar3 = 0;
    while ((victim = *ppCVar4, victim != (CHAR_DATA *)0x0 && (*argument != '\0'))) {
      bVar1 = can_see(ch,victim);
      if (((bVar1) &&
          (((local_1238[0] == '\0' || (bVar1 = is_name(local_1238,victim->name), bVar1)) ||
           ((bVar1 = is_immortal(ch), bVar1 &&
            ((victim->true_name != (char *)0x0 &&
             (bVar1 = is_name(local_1238,victim->true_name), bVar1)))))))) &&
         (iVar3 = iVar3 + 1, iVar3 == iVar2)) {
        return victim;
      }
      ppCVar4 = &victim->next_in_room;
    }
    ch = (CHAR_DATA *)0x0;
  }
  return ch;
}

Assistant:

CHAR_DATA *get_char_room(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	auto count = 0;
	auto number = number_argument(argument, arg);

	if (!str_cmp(arg, "self"))
		return ch;

	for (auto rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (argument[0] == '\0')
			return nullptr;

		if (!can_see(ch, rch))
			continue;

		if (arg[0] != '\0'
			&& !is_name(arg, rch->name)
			&& (!is_immortal(ch) || !rch->true_name || !is_name(arg, rch->true_name)))
			continue;

		if (++count == number)
			return rch;
	}

	return nullptr;
}